

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

qlonglong __thiscall QString::toIntegral_helper(QString *this,QStringView string,bool *ok,int base)

{
  int base_00;
  long in_FS_OFFSET;
  QSimpleParsedNumber<long_long> QVar1;
  QByteArrayView num;
  QVarLengthArray<unsigned_char,_256LL> latin1;
  QVarLengthArray<unsigned_char,_256LL> QStack_148;
  long local_30;
  
  base_00 = (int)ok;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&QStack_148,0xaa,0x118);
  QVarLengthArray<unsigned_char,_256LL>::QVarLengthArray(&QStack_148,(qsizetype)string.m_data);
  qt_to_latin1((uchar *)QStack_148.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr,
               (char16_t *)this,(qsizetype)string.m_data);
  num.m_data = (storage_type *)((ulong)ok & 0xffffffff);
  num.m_size = (qsizetype)QStack_148.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr;
  QVar1 = QLocaleData::bytearrayToLongLong
                    ((QLocaleData *)QStack_148.super_QVLABase<unsigned_char>.super_QVLABaseBase.s,
                     num,base_00);
  if (string.m_size != 0) {
    *(bool *)string.m_size = 0 < QVar1.used;
  }
  QVarLengthArray<unsigned_char,_256LL>::~QVarLengthArray(&QStack_148);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return QVar1.result;
  }
  __stack_chk_fail();
}

Assistant:

qlonglong QString::toIntegral_helper(QStringView string, bool *ok, int base)
{
    return toIntegral<qlonglong>(string, ok, base);
}